

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

int __thiscall testing::internal::ForkingDeathTest::Wait(ForkingDeathTest *this)

{
  bool bVar1;
  __pid_t _Var2;
  int iVar3;
  int *piVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  int local_24;
  int local_20;
  allocator<char> local_19;
  int status_value;
  
  iVar3 = 0;
  if ((this->super_DeathTestImpl).spawned_ == true) {
    DeathTestImpl::ReadAndInterpretStatusByte(&this->super_DeathTestImpl);
    do {
      while( true ) {
        _Var2 = waitpid(*(__pid_t *)&(this->super_DeathTestImpl).field_0x3c,&local_20,0);
        if (_Var2 != -1) break;
        piVar4 = __errno_location();
        if (*piVar4 != 4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_128,"CHECK failed: File ",&local_19);
          std::operator+(&local_68,&local_128,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest-death-test.cc"
                        );
          std::operator+(&local_88,&local_68,", line ");
          local_24 = 0x43d;
          StreamableToString<int>(&local_48,&local_24);
          std::operator+(&local_a8,&local_88,&local_48);
          std::operator+(&local_c8,&local_a8,": ");
          std::operator+(&local_e8,&local_c8,"waitpid(child_pid_, &status_value, 0)");
          std::operator+(&local_108,&local_e8," != -1");
          DeathTestAbort(&local_108);
        }
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    (this->super_DeathTestImpl).status_ = local_20;
    iVar3 = local_20;
  }
  return iVar3;
}

Assistant:

int ForkingDeathTest::Wait() {
  if (!spawned()) return 0;

  ReadAndInterpretStatusByte();

  int status_value;
  GTEST_DEATH_TEST_CHECK_SYSCALL_(waitpid(child_pid_, &status_value, 0));
  set_status(status_value);
  return status_value;
}